

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O2

uint16_t __thiscall
QuickConnection::NewestPacketNumber
          (QuickConnection *this,uint16_t base_packet_number,uint16_t packet_number_mask)

{
  undefined2 in_register_00000012;
  uint16_t number;
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)base_packet_number;
  for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
    if ((CONCAT22(in_register_00000012,packet_number_mask) >> (uVar2 & 0x1f) & 1) != 0) {
      uVar1 = (base_packet_number + 1 & 0xffff) + uVar2;
    }
  }
  return (uint16_t)uVar1;
}

Assistant:

uint16_t QuickConnection::NewestPacketNumber(uint16_t base_packet_number, uint16_t packet_number_mask)
{
	uint16_t number = base_packet_number;
	for (int i = 0; i < MAX_ACK_PACKET_COUNT; i++) {
		if (packet_number_mask & (1 << i)) {
			number = base_packet_number + i + 1;
		}
	}
	return number;
}